

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::internal::MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_>::MakeValue
          (MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_> *this,uint value)

{
  uint value_local;
  MakeValue<fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>_> *this_local;
  
  (this->super_Arg).super_Value.field_0.uint_value = value;
  return;
}

Assistant:

MakeValue(long value) {
    // To minimize the number of types we need to deal with, long is
    // translated either to int or to long long depending on its size.
    if (const_check(sizeof(long) == sizeof(int)))
      int_value = static_cast<int>(value);
    else
      long_long_value = value;
  }